

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v6::internal::
arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::init(arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  val;
  value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  val_00;
  bool bVar2;
  int iVar3;
  type tVar4;
  type tVar5;
  ulong uVar6;
  ulong uVar7;
  entry *peVar8;
  undefined8 *puVar9;
  type type;
  int n;
  int i_1;
  type arg_type;
  int i;
  entry *in_stack_ffffffffffffff80;
  arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint local_3c;
  int local_20;
  
  if (this->map_ == (entry *)0x0) {
    iVar3 = basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            ::max_size((basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                        *)in_stack_ffffffffffffff80);
    tVar4 = to_unsigned<int>(iVar3);
    uVar6 = CONCAT44(0,tVar4);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    uVar7 = SUB168(auVar1 * ZEXT816(0x30),0);
    if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    peVar8 = (entry *)operator_new__(uVar7);
    if (uVar6 != 0) {
      in_stack_ffffffffffffff80 = peVar8;
      do {
        entry::entry(in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1;
      } while (in_stack_ffffffffffffff80 != peVar8 + uVar6);
    }
    this->map_ = peVar8;
    bVar2 = basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            ::is_packed((basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                         *)ctx);
    if (bVar2) {
      local_20 = 0;
      while( true ) {
        tVar5 = basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                ::type((basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                        *)ctx,local_20);
        this = (arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                *)(ulong)tVar5;
        if (tVar5 == none_type) break;
        if (tVar5 == named_arg_type) {
          val.field_0.int128_value._8_4_ = in_stack_ffffffffffffffb8;
          val.field_0.long_long_value = in_stack_ffffffffffffffb0;
          val.field_0.int128_value._12_4_ = in_stack_ffffffffffffffbc;
          push_back(in_stack_ffffffffffffffa8,val);
        }
        local_20 = local_20 + 1;
      }
    }
    else {
      local_3c = 0;
      iVar3 = basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
              ::max_size((basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                          *)in_stack_ffffffffffffff80);
      for (; this = (arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                     *)(ulong)local_3c, (int)local_3c < iVar3; local_3c = local_3c + 1) {
        if (*(int *)(*(long *)(ctx + 8) + (long)(int)local_3c * 0x20 + 0x10) == 1) {
          puVar9 = (undefined8 *)(*(long *)(ctx + 8) + (long)(int)local_3c * 0x20);
          val_00.field_0.int128_value._8_4_ = in_stack_ffffffffffffffb8;
          val_00.field_0.long_long_value = puVar9[1];
          val_00.field_0.int128_value._12_4_ = 1;
          push_back((arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                     *)*puVar9,val_00);
        }
      }
    }
  }
  return (int)this;
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context>& args) {
  if (map_) return;
  map_ = new entry[internal::to_unsigned(args.max_size())];
  if (args.is_packed()) {
    for (int i = 0;; ++i) {
      internal::type arg_type = args.type(i);
      if (arg_type == internal::none_type) return;
      if (arg_type == internal::named_arg_type) push_back(args.values_[i]);
    }
  }
  for (int i = 0, n = args.max_size(); i < n; ++i) {
    auto type = args.args_[i].type_;
    if (type == internal::named_arg_type) push_back(args.args_[i].value_);
  }
}